

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O1

size_t __thiscall
GF2::MI<6UL,_GF2::MOGrevlex<6UL>_>::GatherMinLMons
          (MI<6UL,_GF2::MOGrevlex<6UL>_> *this,MP<6UL,_GF2::MOGrevlex<6UL>_> *polyMons)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  iterator __ret;
  _List_node_base *p_Var4;
  
  GatherLMons(this,polyMons);
  p_Var2 = (polyMons->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>).
           super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  do {
    p_Var4 = p_Var2;
    p_Var3 = (_List_node_base *)polyMons;
    if (p_Var4 == (_List_node_base *)polyMons) {
      return (polyMons->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>).
             super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node._M_size;
    }
    do {
      p_Var3 = (((MP<6UL,_GF2::MOGrevlex<6UL>_> *)p_Var3)->
               super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>).
               super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
               super__List_node_base._M_prev;
      if (p_Var3 == p_Var4) break;
    } while (((ulong)p_Var3[1]._M_next &
             ~*(ulong *)&((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)(p_Var4 + 1))->
                         super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>) != 0);
    p_Var2 = (((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)&p_Var4->_M_next)->
             super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    if (p_Var3 != p_Var4) {
      psVar1 = &(polyMons->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>).
                super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
                _M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var4,0x18);
    }
  } while( true );
}

Assistant:

size_t GatherMinLMons(MP<_n, _O>& polyMons) const
	{
		GatherLMons(polyMons);
		// от старших мономов к младшим
		for (auto iter = polyMons.begin(); iter != polyMons.end();)
		{
			// от младших мономов к старшим
			auto iter1 = --polyMons.end();
			for (; iter1 != iter; --iter1)
				if (*iter1 | *iter)
					break;
			if (iter1 == iter) 
				++iter;
			else 
				iter = polyMons.erase(iter);
		}
		return polyMons.Size();
	}